

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  int iVar1;
  Location *pLVar2;
  Rep *pRVar3;
  uint uVar4;
  LogMessage *pLVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj;
  string *psVar7;
  undefined8 *puVar8;
  ulong uVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar4 = (this->location_->_has_bits_).has_bits_[0];
  if ((uVar4 & 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1f1);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=(&local_61,pLVar5);
    internal::LogMessage::~LogMessage(&local_60);
    uVar4 = (this->location_->_has_bits_).has_bits_[0];
  }
  if ((uVar4 & 2) != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1f2);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_61,pLVar5);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (leading->_M_string_length != 0) {
    pLVar2 = this->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 1;
    uVar9 = (pLVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar8 = (undefined8 *)(uVar9 & 0xfffffffffffffffc);
    if ((uVar9 & 1) != 0) {
      puVar8 = (undefined8 *)*puVar8;
    }
    psVar6 = internal::ArenaStringPtr::Mutable_abi_cxx11_(&pLVar2->leading_comments_,puVar8);
    std::__cxx11::string::swap((string *)psVar6);
  }
  if (trailing->_M_string_length != 0) {
    pLVar2 = this->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 2;
    uVar9 = (pLVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar8 = (undefined8 *)(uVar9 & 0xfffffffffffffffc);
    if ((uVar9 & 1) != 0) {
      puVar8 = (undefined8 *)*puVar8;
    }
    psVar6 = internal::ArenaStringPtr::Mutable_abi_cxx11_(&pLVar2->trailing_comments_,puVar8);
    std::__cxx11::string::swap((string *)psVar6);
  }
  if ((detached_comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (detached_comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      pLVar2 = this->location_;
      pRVar3 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar3 == (Rep *)0x0) {
LAB_003395e0:
        obj = Arena::Create<std::__cxx11::string>
                        ((pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_);
        psVar7 = (string *)
                 internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase,obj);
      }
      else {
        iVar1 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar3->allocated_size <= iVar1) goto LAB_003395e0;
        (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        psVar7 = (string *)pRVar3->elements[iVar1];
      }
      std::__cxx11::string::swap(psVar7);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(detached_comments->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(detached_comments->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(detached_comments);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    std::string* leading, std::string* trailing,
    std::vector<std::string>* detached_comments) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap((*detached_comments)[i]);
  }
  detached_comments->clear();
}